

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::LogParser::~LogParser(LogParser *this)

{
  LogParser *this_local;
  
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_00c16dd8;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_00c16e28;
  (*(this->super_cmXMLParser)._vptr_cmXMLParser[6])(&this->super_cmXMLParser);
  std::vector<char,_std::allocator<char>_>::~vector(&this->CData);
  cmCTestGlobalVC::Change::~Change(&this->CurChange);
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            (&this->Changes);
  cmCTestVC::Revision::~Revision(&this->Rev);
  cmXMLParser::~cmXMLParser(&this->super_cmXMLParser);
  cmProcessTools::OutputLogger::~OutputLogger(&this->super_OutputLogger);
  return;
}

Assistant:

~LogParser() { this->CleanupParser(); }